

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O3

char * json::load<one_int_var>(char *in,size_t len,one_int_var *t,int options)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  property *__i;
  property *ppVar9;
  ulong uVar10;
  property *ppVar11;
  property *ppVar12;
  char *pcVar13;
  property *ppVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  property *__last;
  char cVar20;
  size_t props_size;
  LoadObject serializer;
  prop_map props;
  size_t local_2608;
  int local_25fc;
  LoadObject local_25f8;
  one_int_var *local_25c0;
  property local_25b8;
  property local_2598 [14];
  char *local_23d8;
  size_t asStack_23d0 [3];
  property local_23b8 [284];
  
  local_2608 = 0;
  cVar20 = *in;
  if (cVar20 != '\0') {
    pcVar18 = in + 1;
    local_25fc = options;
    do {
      iVar8 = isspace((int)cVar20);
      if (iVar8 == 0) {
        if (cVar20 == '{') {
          pcVar18 = load_props(pcVar18,in + len,(prop_map *)&local_25b8,&local_2608);
          sVar15 = local_2608;
          if (*pcVar18 != '}') {
            return pcVar18 + -1;
          }
          local_25c0 = t;
          if (local_2608 != 0) {
            __last = &local_25b8 + local_2608;
            lVar2 = 0x3f;
            if (local_2608 != 0) {
              for (; local_2608 >> lVar2 == 0; lVar2 = lVar2 + -1) {
              }
            }
            std::
            __introsort_loop<json::property*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(json::property_const&,json::property_const&)>>
                      (&local_25b8,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<bool_(*)(const_json::property_&,_const_json::property_&)>)
                       0x14c534);
            if ((long)sVar15 < 0x11) {
              if (sVar15 != 1) {
                ppVar12 = local_2598;
                ppVar9 = &local_25b8;
                do {
                  ppVar14 = ppVar12;
                  uVar1 = (ppVar14->param).len;
                  sVar15 = local_25b8.param.len;
                  if (uVar1 < local_25b8.param.len) {
                    sVar15 = uVar1;
                  }
                  if (sVar15 != 0) {
                    pcVar13 = ppVar9[1].param.str;
                    uVar16 = 0;
                    do {
                      cVar20 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str +
                                        uVar16);
                      if (pcVar13[uVar16] < cVar20) goto LAB_0014cf48;
                      if (cVar20 < pcVar13[uVar16]) goto LAB_0014cf8f;
                      uVar16 = uVar16 + 1;
                    } while (sVar15 != uVar16);
                  }
                  if (uVar1 < local_25b8.param.len) {
LAB_0014cf48:
                    local_25f8.props = (prop_map *)(ppVar14->param).str;
                    local_25f8.props_size = (ppVar14->param).len;
                    local_25f8.current = (size_t)(ppVar14->value).str;
                    local_25f8._24_8_ = (ppVar14->value).len;
                    sVar19 = (long)ppVar14 - (long)&local_25b8;
                    memmove((void *)((long)ppVar9 + (0x40 - sVar19)),&local_25b8,sVar19);
                    local_25b8.param.str = (char *)local_25f8.props;
                    local_25b8.param.len = local_25f8.props_size;
                    local_25b8.value.str = (char *)local_25f8.current;
                    local_25b8.value.len = local_25f8._24_8_;
                  }
                  else {
                    pcVar13 = ppVar9[1].param.str;
LAB_0014cf8f:
                    local_25f8.props = (prop_map *)(ppVar14->value).str;
                    local_25f8.props_size = (ppVar14->value).len;
                    uVar16 = (ppVar9->param).len;
                    uVar10 = uVar16;
                    if (uVar1 < uVar16) {
                      uVar10 = uVar1;
                    }
                    ppVar12 = ppVar14;
                    if (uVar10 != 0) {
                      uVar17 = 0;
                      do {
                        cVar20 = (ppVar9->param).str[uVar17];
                        ppVar11 = ppVar14;
                        if (pcVar13[uVar17] < cVar20) goto LAB_0014cfd5;
                        if (cVar20 < pcVar13[uVar17]) goto LAB_0014d027;
                        uVar17 = uVar17 + 1;
                      } while (uVar10 != uVar17);
                    }
joined_r0x0014cfd0:
                    ppVar11 = ppVar12;
                    if (uVar1 < uVar16) {
LAB_0014cfd5:
                      while( true ) {
                        ppVar12 = ppVar9;
                        pcVar3 = (ppVar12->param).str;
                        sVar15 = (ppVar12->param).len;
                        sVar4 = (ppVar12->value).len;
                        (ppVar11->value).str = (ppVar12->value).str;
                        (ppVar11->value).len = sVar4;
                        (ppVar11->param).str = pcVar3;
                        (ppVar11->param).len = sVar15;
                        ppVar9 = ppVar12 + -1;
                        uVar16 = ppVar12[-1].param.len;
                        uVar10 = uVar16;
                        if (uVar1 < uVar16) {
                          uVar10 = uVar1;
                        }
                        if (uVar10 == 0) break;
                        uVar17 = 0;
                        while( true ) {
                          cVar20 = (ppVar9->param).str[uVar17];
                          ppVar11 = ppVar12;
                          if (pcVar13[uVar17] < cVar20) break;
                          if (cVar20 < pcVar13[uVar17]) goto LAB_0014d027;
                          uVar17 = uVar17 + 1;
                          if (uVar10 == uVar17) goto joined_r0x0014cfd0;
                        }
                      }
                      goto joined_r0x0014cfd0;
                    }
LAB_0014d027:
                    (ppVar12->param).str = pcVar13;
                    (ppVar12->param).len = uVar1;
                    (ppVar12->value).str = (char *)local_25f8.props;
                    (ppVar12->value).len = local_25f8.props_size;
                  }
                  ppVar12 = ppVar14 + 1;
                  ppVar9 = ppVar14;
                } while (ppVar14 + 1 != __last);
              }
            }
            else {
              sVar19 = 0x20;
              ppVar9 = &local_25b8;
              do {
                ppVar12 = (property *)((long)&local_25b8.param.str + sVar19);
                uVar1 = *(ulong *)((long)local_2598 + (sVar19 - 0x18));
                sVar15 = local_25b8.param.len;
                if (uVar1 < local_25b8.param.len) {
                  sVar15 = uVar1;
                }
                if (sVar15 != 0) {
                  pcVar13 = (ppVar12->param).str;
                  uVar16 = 0;
                  do {
                    cVar20 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str +
                                      uVar16);
                    if (pcVar13[uVar16] < cVar20) goto LAB_0014cd01;
                    if (cVar20 < pcVar13[uVar16]) goto LAB_0014cd42;
                    uVar16 = uVar16 + 1;
                  } while (sVar15 != uVar16);
                }
                if (uVar1 < local_25b8.param.len) {
LAB_0014cd01:
                  local_25f8.props = (prop_map *)(ppVar12->param).str;
                  local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar19 - 0x18));
                  local_25f8.current = *(undefined8 *)((long)local_2598 + (sVar19 - 0x10));
                  local_25f8._24_8_ = *(size_t *)((long)local_2598 + (sVar19 - 8));
                  memmove(local_2598,&local_25b8,sVar19);
                  local_25b8.param.str = (char *)local_25f8.props;
                  local_25b8.param.len = local_25f8.props_size;
                  local_25b8.value.str = (char *)local_25f8.current;
                  local_25b8.value.len = local_25f8._24_8_;
                }
                else {
                  pcVar13 = (ppVar12->param).str;
LAB_0014cd42:
                  local_25f8.props = *(prop_map **)((long)local_2598 + (sVar19 - 0x10));
                  local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar19 - 8));
                  uVar16 = (ppVar9->param).len;
                  uVar10 = uVar16;
                  if (uVar1 < uVar16) {
                    uVar10 = uVar1;
                  }
                  ppVar14 = ppVar12;
                  if (uVar10 != 0) {
                    uVar17 = 0;
                    do {
                      cVar20 = (ppVar9->param).str[uVar17];
                      ppVar11 = ppVar12;
                      if (pcVar13[uVar17] < cVar20) goto LAB_0014cd87;
                      if (cVar20 < pcVar13[uVar17]) goto LAB_0014cdd9;
                      uVar17 = uVar17 + 1;
                    } while (uVar10 != uVar17);
                  }
joined_r0x0014cd82:
                  ppVar11 = ppVar14;
                  if (uVar1 < uVar16) {
LAB_0014cd87:
                    while( true ) {
                      ppVar14 = ppVar9;
                      pcVar3 = (ppVar14->param).str;
                      sVar15 = (ppVar14->param).len;
                      sVar4 = (ppVar14->value).len;
                      (ppVar11->value).str = (ppVar14->value).str;
                      (ppVar11->value).len = sVar4;
                      (ppVar11->param).str = pcVar3;
                      (ppVar11->param).len = sVar15;
                      ppVar9 = ppVar14 + -1;
                      uVar16 = ppVar14[-1].param.len;
                      uVar10 = uVar16;
                      if (uVar1 < uVar16) {
                        uVar10 = uVar1;
                      }
                      if (uVar10 == 0) break;
                      uVar17 = 0;
                      while( true ) {
                        cVar20 = (ppVar9->param).str[uVar17];
                        ppVar11 = ppVar14;
                        if (pcVar13[uVar17] < cVar20) break;
                        if (cVar20 < pcVar13[uVar17]) goto LAB_0014cdd9;
                        uVar17 = uVar17 + 1;
                        if (uVar10 == uVar17) goto joined_r0x0014cd82;
                      }
                    }
                    goto joined_r0x0014cd82;
                  }
LAB_0014cdd9:
                  (ppVar14->param).str = pcVar13;
                  (ppVar14->param).len = uVar1;
                  (ppVar14->value).str = (char *)local_25f8.props;
                  (ppVar14->value).len = local_25f8.props_size;
                }
                sVar19 = sVar19 + 0x20;
                ppVar9 = ppVar12;
              } while (sVar19 != 0x200);
              ppVar9 = local_23b8;
              do {
                pcVar13 = (ppVar9->param).str;
                uVar1 = (ppVar9->param).len;
                pcVar3 = (ppVar9->value).str;
                sVar15 = (ppVar9->value).len;
                ppVar12 = ppVar9 + -1;
                uVar16 = ppVar9[-1].param.len;
                uVar10 = uVar16;
                if (uVar1 < uVar16) {
                  uVar10 = uVar1;
                }
                ppVar14 = ppVar9;
                if (uVar10 != 0) {
                  uVar17 = 0;
                  do {
                    cVar20 = (ppVar12->param).str[uVar17];
                    ppVar11 = ppVar9;
                    if (pcVar13[uVar17] < cVar20) goto LAB_0014ce54;
                    if (cVar20 < pcVar13[uVar17]) goto LAB_0014cea8;
                    uVar17 = uVar17 + 1;
                  } while (uVar10 != uVar17);
                }
joined_r0x0014ce4f:
                ppVar11 = ppVar14;
                if (uVar1 < uVar16) {
LAB_0014ce54:
                  while( true ) {
                    ppVar14 = ppVar12;
                    pcVar5 = (ppVar14->param).str;
                    sVar4 = (ppVar14->param).len;
                    sVar6 = (ppVar14->value).len;
                    (ppVar11->value).str = (ppVar14->value).str;
                    (ppVar11->value).len = sVar6;
                    (ppVar11->param).str = pcVar5;
                    (ppVar11->param).len = sVar4;
                    ppVar12 = ppVar14 + -1;
                    uVar16 = ppVar14[-1].param.len;
                    uVar10 = uVar16;
                    if (uVar1 < uVar16) {
                      uVar10 = uVar1;
                    }
                    if (uVar10 == 0) break;
                    uVar17 = 0;
                    while( true ) {
                      cVar20 = (ppVar12->param).str[uVar17];
                      ppVar11 = ppVar14;
                      if (pcVar13[uVar17] < cVar20) break;
                      if (cVar20 < pcVar13[uVar17]) goto LAB_0014cea8;
                      uVar17 = uVar17 + 1;
                      if (uVar10 == uVar17) goto joined_r0x0014ce4f;
                    }
                  }
                  goto joined_r0x0014ce4f;
                }
LAB_0014cea8:
                (ppVar14->param).str = pcVar13;
                (ppVar14->param).len = uVar1;
                (ppVar14->value).str = pcVar3;
                (ppVar14->value).len = sVar15;
                ppVar9 = ppVar9 + 1;
              } while (ppVar9 != __last);
            }
          }
          local_25f8.props = (prop_map *)&local_25b8;
          local_25f8.props_size = local_2608;
          local_25f8.current = 0;
          local_25f8.options = local_25fc;
          local_25f8.error_pos = (char *)0x0;
          local_25f8._prev_name = "";
          local_25f8.start = in;
          bVar7 = LoadObject::process<int>(&local_25f8,"val",&local_25c0->val);
          if (!bVar7) {
            return local_25f8.error_pos;
          }
          if (local_25f8.props_size <= local_25f8.current) {
            cVar20 = pcVar18[1];
            while( true ) {
              pcVar13 = pcVar18 + 1;
              if (cVar20 == '\0') {
                return pcVar13;
              }
              iVar8 = isspace((int)cVar20);
              if (iVar8 == 0) break;
              cVar20 = pcVar18[2];
              pcVar18 = pcVar13;
            }
            return pcVar13;
          }
          return (&local_25b8)[local_25f8.current].param.str;
        }
        break;
      }
      cVar20 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    } while (cVar20 != '\0');
    in = pcVar18 + -1;
  }
  return in + -1;
}

Assistant:

const char* load(const char* in, size_t len, V& t, int options) {
	const char* start = in;
	prop_map props;
	size_t props_size = 0;
	in = skip_ws(in);

	if (*in != '{')
		return in - 1;										 // error
	in = load_props(in + 1, start + len, props, props_size); // load prop map for child object
	if (*in != '}')
		return in - 1; // error

	std::sort(props, props + props_size, compare_props);

	LoadObject serializer(props, props_size, start, options);
	if (!serialize(serializer, t))
		return serializer.error_pos;

	if (serializer.current < serializer.props_size)
		return props[serializer.current].param.str;

	in = skip_ws(in + 1); // skip whitespace after
	return in;
}